

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::EqualityComparisonOp<true>::evaluate
          (EqualityComparisonOp<true> *this,ExecValueAccess dst,ExecConstValueAccess a,
          ExecConstValueAccess b)

{
  float fVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  ulong uVar5;
  VariableType *this_00;
  Scalar *pSVar6;
  long lVar7;
  int iVar8;
  Scalar *pSVar9;
  long lVar10;
  bool bVar11;
  
  pSVar9 = a.m_value;
  this_00 = a.m_type;
  pSVar6 = dst.super_ConstStridedValueAccess<64>.m_value;
  TVar3 = this_00->m_baseType;
  if (TVar3 == TYPE_FLOAT) {
    uVar5 = (ulong)(uint)this_00->m_numElements;
    lVar7 = 0;
    do {
      if ((int)uVar5 < 1) {
        bVar11 = true;
      }
      else {
        bVar11 = true;
        iVar8 = 0;
        lVar10 = 0;
        do {
          VariableType::getElementType(this_00);
          fVar1 = pSVar9[lVar7 + iVar8].floatVal;
          VariableType::getElementType(b.m_type);
          bVar11 = (bool)(bVar11 & fVar1 == b.m_value[lVar7 + iVar8].floatVal);
          lVar10 = lVar10 + 1;
          uVar5 = (ulong)this_00->m_numElements;
          iVar8 = iVar8 + 0x40;
        } while (lVar10 < (long)uVar5);
      }
      pSVar6[lVar7].boolVal = bVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
  }
  else if (TVar3 == TYPE_INT) {
    uVar5 = (ulong)(uint)this_00->m_numElements;
    lVar7 = 0;
    do {
      if ((int)uVar5 < 1) {
        bVar11 = true;
      }
      else {
        bVar11 = true;
        iVar8 = 0;
        lVar10 = 0;
        do {
          VariableType::getElementType(this_00);
          iVar4 = pSVar9[lVar7 + iVar8].intVal;
          VariableType::getElementType(b.m_type);
          bVar11 = (bool)(bVar11 & iVar4 == b.m_value[lVar7 + iVar8].intVal);
          lVar10 = lVar10 + 1;
          uVar5 = (ulong)this_00->m_numElements;
          iVar8 = iVar8 + 0x40;
        } while (lVar10 < (long)uVar5);
      }
      pSVar6[lVar7].boolVal = bVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
  }
  else if (TVar3 == TYPE_BOOL) {
    uVar5 = (ulong)(uint)this_00->m_numElements;
    lVar7 = 0;
    do {
      if ((int)uVar5 < 1) {
        bVar11 = true;
      }
      else {
        bVar11 = true;
        iVar8 = 0;
        lVar10 = 0;
        do {
          VariableType::getElementType(this_00);
          bVar2 = pSVar9[lVar7 + iVar8].boolVal;
          VariableType::getElementType(b.m_type);
          bVar11 = (bool)(bVar11 & bVar2 == b.m_value[lVar7 + iVar8].boolVal);
          lVar10 = lVar10 + 1;
          uVar5 = (ulong)this_00->m_numElements;
          iVar8 = iVar8 + 0x40;
        } while (lVar10 < (long)uVar5);
      }
      pSVar6[lVar7].boolVal = bVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
  }
  return;
}

Assistant:

void EqualityComparisonOp<IsEqual>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());


	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asBool(compNdx), b.component(elemNdx).asBool(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}